

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall IlmThread_2_5::Task::Task(Task *this,TaskGroup *g)

{
  int iVar1;
  Data *pDVar2;
  
  this->_vptr_Task = (_func_int **)&PTR__Task_0303e040;
  this->_group = g;
  if (g != (TaskGroup *)0x0) {
    pDVar2 = g->_data;
    LOCK();
    iVar1 = (pDVar2->numPending).super___atomic_base<int>._M_i;
    (pDVar2->numPending).super___atomic_base<int>._M_i =
         (pDVar2->numPending).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (iVar1 == 0) {
      Semaphore::wait(&pDVar2->isEmpty,g);
      return;
    }
  }
  return;
}

Assistant:

Task::Task (TaskGroup* g): _group(g)
{
    if ( g )
        g->_data->addTask ();
}